

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O2

usize __thiscall
Console::Prompt::Private::readBufferedEscapedSequence(Private *this,char *seqStart,char *buffer)

{
  byte *pbVar1;
  bool bVar2;
  usize uVar3;
  long lVar4;
  
  lVar4 = 0;
  while( true ) {
    pbVar1 = (this->bufferedInput).bufferStart;
    if (pbVar1 == (this->bufferedInput).bufferEnd) {
      uVar3 = readUnbufferedEscapedSequence(this,seqStart,buffer + lVar4);
      return lVar4 + uVar3;
    }
    buffer[lVar4] = *pbVar1;
    Buffer::removeFront(&this->bufferedInput,1);
    if ((seqStart[1] != '[') || (bVar2 = isSeqAttributeChar(buffer[lVar4]), !bVar2)) break;
    lVar4 = lVar4 + 1;
  }
  buffer[lVar4 + 1] = '\0';
  return lVar4 + 1;
}

Assistant:

usize readBufferedEscapedSequence(const char* seqStart, char* buffer)
  {
    for(char* start = buffer;;)
    {
      if(bufferedInput.isEmpty())
        return buffer - start + readUnbufferedEscapedSequence(seqStart, buffer);
      *buffer = *(const char*)(const byte*)bufferedInput;
      bufferedInput.removeFront(1);
      if(seqStart[1] != '[' || !isSeqAttributeChar(*buffer))
      {
        ++buffer;
        *buffer = '\0';
        return buffer - start;
      }
      ++buffer;
    }
  }